

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.h
# Opt level: O3

int base32_encode(uint8_t *data,int length,uint8_t *result,int bufSize)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  iVar1 = -1;
  if ((uint)length < 0x10000001) {
    uVar2 = 0;
    if (bufSize < 1 || length == 0) {
LAB_001605c0:
      iVar1 = (int)uVar2;
      if (iVar1 < bufSize) {
        result[uVar2 & 0xffffffff] = '\0';
      }
    }
    else {
      uVar6 = (uint)*data;
      iVar4 = 1;
      iVar3 = 8;
      uVar2 = 0;
      do {
        if (length <= iVar4 && iVar3 < 1) goto LAB_001605c0;
        if (iVar3 < 5) {
          if (iVar4 < length) {
            lVar5 = (long)iVar4;
            iVar4 = iVar4 + 1;
            uVar6 = uVar6 << 8 | (uint)data[lVar5];
            iVar3 = iVar3 + 8;
          }
          else {
            uVar6 = uVar6 << (5U - (char)iVar3 & 0x1f);
            iVar3 = 5;
          }
        }
        iVar3 = iVar3 + -5;
        result[uVar2] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[(int)uVar6 >> ((byte)iVar3 & 0x1f) & 0x1f];
        uVar2 = uVar2 + 1;
        iVar1 = bufSize;
      } while ((uint)bufSize != uVar2);
    }
  }
  return iVar1;
}

Assistant:

int base32_encode(const uint8_t *data, int length, uint8_t *result, int bufSize) {
  if (length < 0 || length > (1 << 28)) {
    return -1;
  }
  int count = 0;
  if (length > 0) {
    int buffer = data[0];
    int next = 1;
    int bitsLeft = 8;
    while (count < bufSize && (bitsLeft > 0 || next < length)) {
      if (bitsLeft < 5) {
        if (next < length) {
          buffer <<= 8;
          buffer |= data[next++] & 0xFF;
          bitsLeft += 8;
        } else {
          int pad = 5 - bitsLeft;
          buffer <<= pad;
          bitsLeft += pad;
        }
      }
      int index = 0x1F & (buffer >> (bitsLeft - 5));
      bitsLeft -= 5;
      result[count++] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[index];
    }
  }
  if (count < bufSize) {
    result[count] = '\000';
  }
  return count;
}